

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

string * minja::strip(string *__return_storage_ptr__,string *s,string *chars,bool left,bool right)

{
  long lVar1;
  allocator<char> local_41;
  string charset;
  
  if (chars->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&charset," \t\n\r",&local_41);
  }
  else {
    std::__cxx11::string::string((string *)&charset,(string *)chars);
  }
  if ((left) &&
     (lVar1 = std::__cxx11::string::find_first_not_of((string *)s,(ulong)&charset), lVar1 == -1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_41);
  }
  else {
    if (right) {
      std::__cxx11::string::find_last_not_of((string *)s,(ulong)&charset);
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  std::__cxx11::string::~string((string *)&charset);
  return __return_storage_ptr__;
}

Assistant:

static std::string strip(const std::string & s, const std::string & chars = "", bool left = true, bool right = true) {
  auto charset = chars.empty() ? " \t\n\r" : chars;
  auto start = left ? s.find_first_not_of(charset) : 0;
  if (start == std::string::npos) return "";
  auto end = right ? s.find_last_not_of(charset) : s.size() - 1;
  return s.substr(start, end - start + 1);
}